

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryCollectGarbage(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  CallFlags e;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *this;
  undefined4 *puVar4;
  Recycler *this_00;
  Var *values;
  Var aValue;
  ScriptContext *scriptContext_00;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar5;
  double dVar6;
  double value;
  ArgumentReader args;
  Var *_argsVarArray;
  Recycler *recycler;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  if ((DAT_01ec73c4 & 1) != 0) {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n");
    Output::Flush();
  }
  DebugClearStack();
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x604,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetRecycler(pSVar3);
  if (this_00 != (Recycler *)0x0) {
    n = _count_args((CallInfo)function_local);
    values = _get_va(&stack0x00000000,n);
    args.super_Arguments.Values = (Type)function_local;
    bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x60c,
                                  "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)"
                                  ,"*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ArgumentReader::ArgumentReader((ArgumentReader *)&value,(CallInfo *)&function_local,values);
    if ((SUB84(value,0) & 0xffffff) != 1 && ((ulong)value & 0xffffff) != 0) {
      aValue = Arguments::operator[]((Arguments *)&value,1);
      scriptContext_00 = RecyclableObject::GetScriptContext(function);
      dVar6 = JavascriptConversion::ToNumber(aValue,scriptContext_00);
      if ((dVar6 == 1.0) && (!NAN(dVar6))) {
        this_00->dumpObjectOnceOnCollect = true;
      }
    }
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)3221524480>(this_00);
  }
  if ((DAT_01ec73c4 & 1) != 0) {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n");
    Output::Flush();
  }
  this_01 = ScriptContext::GetLibrary(pSVar3);
  pRVar5 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  return pRVar5;
}

Assistant:

Var GlobalObject::EntryCollectGarbage(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n"));
            Output::Flush();
        }
#endif

#if DBG
        // Clear 1K of stack to avoid false positive in debug build.
        // Because we don't debug build don't stack pack
        DebugClearStack();
#endif
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        Recycler* recycler = scriptContext->GetRecycler();
        if (recycler)
        {
#if DBG && defined(RECYCLER_DUMP_OBJECT_GRAPH)
            ARGUMENTS(args, callInfo);
            if (args.Info.Count > 1)
            {
                double value = JavascriptConversion::ToNumber(args[1], function->GetScriptContext());
                if (value == 1.0)
                {
                    recycler->dumpObjectOnceOnCollect = true;
                }
            }
#endif
            recycler->CollectNow<CollectNowDecommitNowExplicit>();
        }

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n"));
            Output::Flush();
        }
#endif

        return scriptContext->GetLibrary()->GetUndefined();
    }